

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

void __thiscall
pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::push_back
          (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *this,float *value)

{
  float *in_RSI;
  polymorphic_allocator<float> *in_RDI;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *unaff_retaddr;
  
  if (in_RDI[2].memoryResource == in_RDI[3].memoryResource) {
    reserve(unaff_retaddr,(size_t)in_RDI);
  }
  pmr::polymorphic_allocator<float>::construct<float,float>
            (in_RDI,(float *)((long)&(in_RDI[1].memoryResource)->_vptr_memory_resource +
                             (long)in_RDI[3].memoryResource * 4),in_RSI);
  in_RDI[3].memoryResource =
       (memory_resource *)((long)&(in_RDI[3].memoryResource)->_vptr_memory_resource + 1);
  return;
}

Assistant:

void push_back(T &&value) {
        if (nAlloc == nStored)
            reserve(nAlloc == 0 ? 4 : 2 * nAlloc);

        alloc.construct(ptr + nStored, std::move(value));
        ++nStored;
    }